

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqliteBitvecTest(Bitvec *p,pgno i)

{
  bitvec_rec *pbVar1;
  
  pbVar1 = p->apRec[(uint)i & p->nSize - 1];
  while( true ) {
    if (pbVar1 == (bitvec_rec *)0x0) {
      return 0;
    }
    if (pbVar1->iPage == i) {
      return 1;
    }
    pbVar1 = pbVar1->pNextCol;
    if (pbVar1 == (bitvec_rec *)0x0) {
      return 0;
    }
    if (pbVar1->iPage == i) {
      return 1;
    }
    pbVar1 = pbVar1->pNextCol;
    if (pbVar1 == (bitvec_rec *)0x0) {
      return 0;
    }
    if (pbVar1->iPage == i) {
      return 1;
    }
    pbVar1 = pbVar1->pNextCol;
    if (pbVar1 == (bitvec_rec *)0x0) {
      return 0;
    }
    if (pbVar1->iPage == i) break;
    pbVar1 = pbVar1->pNextCol;
  }
  return 1;
}

Assistant:

UNQLITE_PRIVATE int unqliteBitvecTest(Bitvec *p,pgno i)
{  
	bitvec_rec *pRec;
	/* Point to the desired bucket */
	pRec = p->apRec[i & (p->nSize - 1)];
	for(;;){
		if( pRec == 0 ){ break; }
		if( pRec->iPage == i ){
			/* Page found */
			return 1;
		}
		/* Point to the next entry */
		pRec = pRec->pNextCol;

		if( pRec == 0 ){ break; }
		if( pRec->iPage == i ){
			/* Page found */
			return 1;
		}
		/* Point to the next entry */
		pRec = pRec->pNextCol;


		if( pRec == 0 ){ break; }
		if( pRec->iPage == i ){
			/* Page found */
			return 1;
		}
		/* Point to the next entry */
		pRec = pRec->pNextCol;


		if( pRec == 0 ){ break; }
		if( pRec->iPage == i ){
			/* Page found */
			return 1;
		}
		/* Point to the next entry */
		pRec = pRec->pNextCol;
	}
	/* No such entry */
	return 0;
}